

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManResubTest(Gia_Man_t *p)

{
  Gia_Man_t *p_00;
  abctime aVar1;
  Vec_Wec_t *vMffcs;
  abctime aVar2;
  int level;
  
  p_00 = Gia_ManDupMuxes(p,2);
  aVar1 = Abc_Clock();
  vMffcs = Gia_ManComputeMffcs(p_00,4,100,8,100);
  Gia_ManAddDivisors(p_00,vMffcs);
  Vec_WecFree(vMffcs);
  level = (int)vMffcs;
  aVar2 = Abc_Clock();
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManResubTest( Gia_Man_t * p )
{
    Vec_Wec_t * vMffcs;
    Gia_Man_t * pNew = Gia_ManDupMuxes( p, 2 );
abctime clkStart = Abc_Clock();
    vMffcs = Gia_ManComputeMffcs( pNew, 4, 100, 8, 100 );
    Gia_ManAddDivisors( pNew, vMffcs );
    Vec_WecFree( vMffcs );
Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Gia_ManStop( pNew );
}